

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

bool __thiscall
testing::internal::OnCallSpec<void_(__locale_struct_*)>::Matches
          (OnCallSpec<void_(__locale_struct_*)> *this,ArgumentTuple *args)

{
  bool bVar1;
  
  bVar1 = TuplePrefix<1ul>::
          Matches<std::tr1::tuple<testing::Matcher<__locale_struct*>,void,void,void,void,void,void,void,void,void>,std::tr1::tuple<__locale_struct*,void,void,void,void,void,void,void,void,void>>
                    ((tuple<testing::Matcher<__locale_struct_*>,_void,_void,_void,_void,_void,_void,_void,_void,_void>
                      *)(this + 0x10),args);
  if (bVar1) {
    bVar1 = MatcherBase<const_std::tr1::tuple<__locale_struct_*,_void,_void,_void,_void,_void,_void,_void,_void,_void>_&>
            ::Matches((MatcherBase<const_std::tr1::tuple<__locale_struct_*,_void,_void,_void,_void,_void,_void,_void,_void,_void>_&>
                       *)(this + 0x28),args);
    return bVar1;
  }
  return false;
}

Assistant:

bool Matches(const ArgumentTuple& args) const {
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }